

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O3

void __thiscall
TPZElementMatrixT<std::complex<double>_>::SetMatrixMinSize
          (TPZElementMatrixT<std::complex<double>_> *this,short NumBli,short NumBlj,short BlSizei,
          short BlSizej)

{
  long lVar1;
  long lVar2;
  complex<double> *pcVar3;
  complex<double> *__s;
  undefined2 in_register_0000000a;
  undefined6 in_register_00000012;
  long lVar4;
  undefined6 in_register_00000032;
  undefined2 in_register_00000082;
  long lVar5;
  ulong uVar6;
  
  lVar1 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  lVar2 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  lVar5 = (long)CONCAT22(in_register_0000000a,BlSizei) *
          (long)(int)CONCAT62(in_register_00000032,NumBli);
  lVar4 = (long)CONCAT22(in_register_00000082,BlSizej) *
          (long)(int)CONCAT62(in_register_00000012,NumBlj);
  if (lVar2 < lVar4 || lVar1 < lVar5) {
    uVar6 = lVar4 * lVar5;
    if (uVar6 - lVar2 * lVar1 != 0) {
      pcVar3 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem;
      __s = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      if (pcVar3 != __s && pcVar3 != (complex<double> *)0x0) {
        operator_delete__(pcVar3);
        __s = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      }
      if ((__s == (complex<double> *)0x0) ||
         (lVar1 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fSize,
         uVar6 - lVar1 != 0 && lVar1 <= (long)uVar6)) {
        if (uVar6 == 0) {
          __s = (complex<double> *)0x0;
        }
        else {
          __s = (complex<double> *)operator_new__(-(ulong)(uVar6 >> 0x3c != 0) | uVar6 * 0x10);
          memset(__s,0,uVar6 * 0x10);
        }
      }
      (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem = __s;
    }
    (this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
    super_TPZBaseMatrix.fRow = lVar5;
    (this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
    super_TPZBaseMatrix.fCol = lVar4;
    (*(this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(&this->fMat);
    return;
  }
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::SetMatrixMinSize(short NumBli, short NumBlj, 
										short BlSizei, short BlSizej) {
	
	
	if(fMat.Rows() < NumBli*BlSizei || fMat.Cols() < NumBlj*BlSizej) {
		fMat.Redim(NumBli*BlSizei,NumBlj*BlSizej);
	}
}